

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O3

void duckdb::InSearchPathFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  undefined8 uVar3;
  UnifiedVectorFormat *pUVar4;
  ValidityMask *pVVar5;
  long lVar6;
  long lVar7;
  ClientContext *pCVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  bool bVar11;
  UnifiedVectorFormat UVar12;
  ClientContext *pCVar13;
  long lVar14;
  BinaryLambdaWrapper *this_00;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar15;
  UnifiedVectorFormat *idx;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  idx_t iVar18;
  idx_t iVar19;
  ulong uVar20;
  long lVar21;
  idx_t idx_in_entry;
  ulong uVar22;
  UnifiedVectorFormat *pUVar23;
  VectorType VVar24;
  ulong uVar25;
  undefined8 *puVar26;
  UnifiedVectorFormat *pUVar27;
  ulong uVar28;
  anon_class_16_2_9a274d3c fun;
  anon_class_16_2_9a274d3c fun_00;
  anon_class_16_2_9a274d3c fun_01;
  anon_class_16_2_9a274d3c fun_02;
  anon_class_16_2_9a274d3c fun_03;
  anon_class_16_2_9a274d3c fun_04;
  anon_class_16_2_9a274d3c fun_05;
  anon_class_16_2_9a274d3c fun_06;
  anon_class_16_2_9a274d3c fun_07;
  anon_class_16_2_9a274d3c fun_08;
  anon_class_16_2_9a274d3c fun_09;
  anon_class_16_2_9a274d3c fun_10;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  UnifiedVectorFormat ldata;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 *puVar29;
  long lVar30;
  idx_t in_stack_fffffffffffffed8;
  idx_t iVar31;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  idx_t local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pCVar13 = (ClientContext *)duckdb::ExpressionState::GetContext();
  lVar14 = duckdb::ClientData::Get(pCVar13);
  this_00 = (BinaryLambdaWrapper *)(lVar14 + 0x78);
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar24 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar24);
    uVar3 = *(undefined8 *)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      right.value.pointer.ptr = (char *)in_stack_fffffffffffffed0;
      right.value._0_8_ = in_stack_fffffffffffffec8;
      fun.context = (ClientContext *)**(undefined8 **)(vector + 0x20);
      fun.search_path =
           (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
            *)pCVar13;
      left.value.pointer.ptr = (char *)**(undefined8 **)(vector_00 + 0x20);
      left.value._0_8_ = (*(undefined8 **)(vector + 0x20))[1];
      bVar11 = BinaryLambdaWrapper::
               Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                         (this_00,fun,left,right,
                          (ValidityMask *)(*(undefined8 **)(vector_00 + 0x20))[1],
                          in_stack_fffffffffffffed8);
      *(bool *)uVar3 = bVar11;
      return;
    }
  }
  else {
    pUVar4 = *(UnifiedVectorFormat **)(input + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      puVar29 = *(undefined8 **)(vector_00 + 0x20);
      lVar14 = *(long *)(vector + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar24);
        iVar31 = *(idx_t *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar4 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          uVar3 = *puVar29;
          pVVar5 = (ValidityMask *)puVar29[1];
          puVar29 = (undefined8 *)(lVar14 + 8);
          pUVar27 = (UnifiedVectorFormat *)0x0;
          do {
            right_05.value.pointer.ptr = (char *)puVar29;
            right_05.value._0_8_ = in_stack_fffffffffffffec8;
            fun_05.context = (ClientContext *)puVar29[-1];
            fun_05.search_path =
                 (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)pCVar13;
            left_05.value.pointer.ptr = (char *)uVar3;
            left_05.value._0_8_ = *puVar29;
            UVar12 = (UnifiedVectorFormat)
                     BinaryLambdaWrapper::
                     Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                               (this_00,fun_05,left_05,right_05,pVVar5,iVar31);
            pUVar27[iVar31] = UVar12;
            pUVar27 = pUVar27 + 1;
            puVar29 = puVar29 + 2;
          } while (pUVar4 != pUVar27);
          return;
        }
        if (pUVar4 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar14 = lVar14 + 8;
        uVar22 = 0;
        iVar18 = iVar31;
        pUVar27 = (UnifiedVectorFormat *)0x0;
        do {
          iVar19 = iVar18;
          if (*(long *)(result + 0x28) == 0) {
            pUVar15 = pUVar27 + 0x40;
            if (pUVar4 <= pUVar27 + 0x40) {
              pUVar15 = pUVar4;
            }
LAB_006717dd:
            pUVar23 = pUVar27;
            if (pUVar27 < pUVar15) {
              uVar3 = *puVar29;
              pVVar5 = (ValidityMask *)puVar29[1];
              puVar26 = (undefined8 *)((long)pUVar27 * 0x10 + lVar14);
              do {
                right_01.value.pointer.ptr = (char *)lVar14;
                right_01.value._0_8_ = in_stack_fffffffffffffec8;
                fun_01.context = (ClientContext *)puVar26[-1];
                fun_01.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)pCVar13;
                left_01.value.pointer.ptr = (char *)uVar3;
                left_01.value._0_8_ = *puVar26;
                UVar12 = (UnifiedVectorFormat)
                         BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (this_00,fun_01,left_01,right_01,pVVar5,iVar31);
                pUVar27[iVar31] = UVar12;
                pUVar27 = pUVar27 + 1;
                puVar26 = puVar26 + 2;
                iVar19 = iVar31;
                pUVar23 = pUVar15;
              } while (pUVar15 != pUVar27);
            }
          }
          else {
            uVar20 = *(ulong *)(*(long *)(result + 0x28) + uVar22 * 8);
            pUVar15 = pUVar27 + 0x40;
            if (pUVar4 <= pUVar27 + 0x40) {
              pUVar15 = pUVar4;
            }
            pUVar23 = pUVar15;
            if (uVar20 != 0) {
              if (uVar20 == 0xffffffffffffffff) goto LAB_006717dd;
              pUVar23 = pUVar27;
              if (pUVar27 < pUVar15) {
                puVar26 = (undefined8 *)((long)pUVar27 * 0x10 + lVar14);
                uVar25 = 0;
                do {
                  if ((uVar20 >> (uVar25 & 0x3f) & 1) != 0) {
                    right_00.value.pointer.ptr = (char *)lVar14;
                    right_00.value._0_8_ = in_stack_fffffffffffffec8;
                    fun_00.context = (ClientContext *)puVar26[-1];
                    fun_00.search_path =
                         (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                          *)pCVar13;
                    left_00.value.pointer.ptr = (char *)*puVar29;
                    left_00.value._0_8_ = *puVar26;
                    iVar19 = iVar31;
                    UVar12 = (UnifiedVectorFormat)
                             BinaryLambdaWrapper::
                             Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (this_00,fun_00,left_00,right_00,(ValidityMask *)puVar29[1],
                                        iVar31);
                    pUVar27[uVar25 + iVar18] = UVar12;
                    iVar31 = iVar19;
                  }
                  uVar25 = uVar25 + 1;
                  puVar26 = puVar26 + 2;
                  pUVar23 = pUVar15;
                } while ((long)pUVar15 - (long)pUVar27 != uVar25);
              }
            }
          }
          uVar22 = uVar22 + 1;
          iVar18 = iVar19;
          pUVar27 = pUVar23;
          if (uVar22 == (ulong)(pUVar4 + 0x3f) >> 6) {
            return;
          }
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar14 = *(long *)(vector + 0x20);
          lVar6 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar24);
          lVar7 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar4 != (UnifiedVectorFormat *)0x0) {
              lVar21 = 8;
              pUVar27 = (UnifiedVectorFormat *)0x0;
              lVar30 = lVar14;
              do {
                right_10.value.pointer.ptr = (char *)lVar30;
                right_10.value._0_8_ = in_stack_fffffffffffffec8;
                fun_10.context = *(ClientContext **)(lVar14 + -8 + lVar21);
                fun_10.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)pCVar13;
                left_10.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + lVar21);
                left_10.value._0_8_ = *(undefined8 *)(lVar14 + lVar21);
                UVar12 = (UnifiedVectorFormat)
                         BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (this_00,fun_10,left_10,right_10,
                                    *(ValidityMask **)(lVar6 + lVar21),in_stack_fffffffffffffed8);
                pUVar27[lVar7] = UVar12;
                pUVar27 = pUVar27 + 1;
                lVar21 = lVar21 + 0x10;
              } while (pUVar4 != pUVar27);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar4 + 0x3f) {
            uVar22 = 0;
            pUVar27 = (UnifiedVectorFormat *)0x0;
            do {
              lVar30 = *(long *)(result + 0x28);
              lVar21 = lVar14;
              if (lVar30 == 0) {
                pUVar15 = pUVar27 + 0x40;
                if (pUVar4 <= pUVar27 + 0x40) {
                  pUVar15 = pUVar4;
                }
LAB_00671d05:
                pUVar23 = pUVar27;
                if (pUVar27 < pUVar15) {
                  uVar20 = (long)pUVar27 << 4 | 8;
                  do {
                    right_06.value.pointer.ptr = (char *)lVar21;
                    right_06.value._0_8_ = in_stack_fffffffffffffec8;
                    fun_06.context = *(ClientContext **)(lVar14 + -8 + uVar20);
                    fun_06.search_path =
                         (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                          *)pCVar13;
                    left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + uVar20);
                    left_06.value._0_8_ = *(undefined8 *)(lVar14 + uVar20);
                    UVar12 = (UnifiedVectorFormat)
                             BinaryLambdaWrapper::
                             Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (this_00,fun_06,left_06,right_06,
                                        *(ValidityMask **)(lVar6 + uVar20),(idx_t)pUVar15);
                    pUVar27[lVar7] = UVar12;
                    pUVar27 = pUVar27 + 1;
                    uVar20 = uVar20 + 0x10;
                    pUVar23 = pUVar15;
                  } while (pUVar15 != pUVar27);
                }
              }
              else {
                uVar20 = *(ulong *)(lVar30 + uVar22 * 8);
                pUVar15 = pUVar27 + 0x40;
                if (pUVar4 <= pUVar27 + 0x40) {
                  pUVar15 = pUVar4;
                }
                pUVar23 = pUVar15;
                if (uVar20 != 0) {
                  if (uVar20 == 0xffffffffffffffff) goto LAB_00671d05;
                  pUVar23 = pUVar27;
                  if (pUVar27 < pUVar15) {
                    idx = pUVar27 + lVar7;
                    uVar28 = (long)pUVar27 << 4 | 8;
                    uVar25 = 0;
                    do {
                      if ((uVar20 >> (uVar25 & 0x3f) & 1) != 0) {
                        right_07.value.pointer.ptr = (char *)lVar14;
                        right_07.value._0_8_ = in_stack_fffffffffffffec8;
                        fun_07.context = *(ClientContext **)(lVar14 + -8 + uVar28);
                        fun_07.search_path =
                             (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                              *)pCVar13;
                        left_07.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + uVar28);
                        left_07.value._0_8_ = *(undefined8 *)(lVar14 + uVar28);
                        UVar12 = (UnifiedVectorFormat)
                                 BinaryLambdaWrapper::
                                 Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                           (this_00,fun_07,left_07,right_07,
                                            *(ValidityMask **)(lVar6 + uVar28),(idx_t)idx);
                        idx[uVar25] = UVar12;
                      }
                      uVar25 = uVar25 + 1;
                      uVar28 = uVar28 + 0x10;
                      pUVar23 = pUVar15;
                      lVar21 = lVar14;
                    } while ((long)pUVar15 - (long)pUVar27 != uVar25);
                  }
                }
              }
              uVar22 = uVar22 + 1;
              pUVar27 = pUVar23;
              lVar14 = lVar21;
            } while (uVar22 != (ulong)(pUVar4 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar4);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar4);
          duckdb::Vector::SetVectorType(VVar24);
          lVar14 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (pUVar4 != (UnifiedVectorFormat *)0x0) {
              lVar6 = *local_78;
              lVar7 = *local_c0;
              pUVar27 = (UnifiedVectorFormat *)0x0;
              iVar31 = local_70;
              do {
                pUVar15 = pUVar27;
                if (lVar6 != 0) {
                  pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar27 * 4);
                }
                pUVar23 = pUVar27;
                if (lVar7 != 0) {
                  pUVar23 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar27 * 4);
                }
                right_02.value.pointer.ptr = (char *)in_stack_fffffffffffffed0;
                right_02.value._0_8_ = in_stack_fffffffffffffec8;
                fun_02.context = *(ClientContext **)(iVar31 + (long)pUVar15 * 0x10);
                fun_02.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)pCVar13;
                left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar23 * 0x10)
                ;
                left_02.value._0_8_ = *(undefined8 *)(iVar31 + 8 + (long)pUVar15 * 0x10);
                UVar12 = (UnifiedVectorFormat)
                         BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (this_00,fun_02,left_02,right_02,
                                    *(ValidityMask **)(local_b8 + 8 + (long)pUVar23 * 0x10),iVar31);
                pUVar27[lVar14] = UVar12;
                pUVar27 = pUVar27 + 1;
              } while (pUVar4 != pUVar27);
            }
          }
          else if (pUVar4 != (UnifiedVectorFormat *)0x0) {
            lVar6 = *local_78;
            lVar7 = *local_c0;
            pUVar27 = (UnifiedVectorFormat *)0x0;
            iVar31 = local_70;
            do {
              pUVar15 = pUVar27;
              if (lVar6 != 0) {
                pUVar15 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar6 + (long)pUVar27 * 4);
              }
              pUVar23 = pUVar27;
              if (lVar7 != 0) {
                pUVar23 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar7 + (long)pUVar27 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar15 >> 6) * 8) >> ((ulong)pUVar15 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar23 >> 6) * 8) >> ((ulong)pUVar23 & 0x3f) & 1)
                   != 0)))) {
                right_08.value.pointer.ptr = (char *)in_stack_fffffffffffffed0;
                right_08.value._0_8_ = in_stack_fffffffffffffec8;
                fun_08.context = *(ClientContext **)(iVar31 + (long)pUVar15 * 0x10);
                fun_08.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)pCVar13;
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar23 * 0x10)
                ;
                left_08.value._0_8_ = *(undefined8 *)(iVar31 + 8 + (long)pUVar15 * 0x10);
                UVar12 = (UnifiedVectorFormat)
                         BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (this_00,fun_08,left_08,right_08,
                                    *(ValidityMask **)(local_b8 + 8 + (long)pUVar23 * 0x10),iVar31);
                pUVar27[lVar14] = UVar12;
              }
              else {
                _Var17._M_head_impl = *(unsigned_long **)(result + 0x28);
                if (_Var17._M_head_impl == (unsigned_long *)0x0) {
                  local_c8 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var10 = p_Stack_d0;
                  uVar3 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar3;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
                  if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
                     p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  _Var17._M_head_impl =
                       (pTVar16->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  *(unsigned_long **)(result + 0x28) = _Var17._M_head_impl;
                }
                bVar9 = (byte)pUVar27 & 0x3f;
                _Var17._M_head_impl[(ulong)pUVar27 >> 6] =
                     _Var17._M_head_impl[(ulong)pUVar27 >> 6] &
                     (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
              pUVar27 = pUVar27 + 1;
            } while (pUVar4 != pUVar27);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      puVar29 = *(undefined8 **)(vector + 0x20);
      lVar14 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar24);
        iVar31 = *(idx_t *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar4 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          pCVar8 = (ClientContext *)*puVar29;
          uVar3 = puVar29[1];
          puVar29 = (undefined8 *)(lVar14 + 8);
          pUVar27 = (UnifiedVectorFormat *)0x0;
          do {
            right_09.value.pointer.ptr = (char *)puVar29;
            right_09.value._0_8_ = in_stack_fffffffffffffec8;
            fun_09.context = pCVar8;
            fun_09.search_path =
                 (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                  *)pCVar13;
            left_09.value.pointer.ptr = (char *)puVar29[-1];
            left_09.value._0_8_ = uVar3;
            UVar12 = (UnifiedVectorFormat)
                     BinaryLambdaWrapper::
                     Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                               (this_00,fun_09,left_09,right_09,(ValidityMask *)*puVar29,iVar31);
            pUVar27[iVar31] = UVar12;
            pUVar27 = pUVar27 + 1;
            puVar29 = puVar29 + 2;
          } while (pUVar4 != pUVar27);
          return;
        }
        if (pUVar4 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar14 = lVar14 + 8;
        uVar22 = 0;
        iVar18 = iVar31;
        pUVar27 = (UnifiedVectorFormat *)0x0;
        do {
          iVar19 = iVar18;
          if (*(long *)(result + 0x28) == 0) {
            pUVar15 = pUVar27 + 0x40;
            if (pUVar4 <= pUVar27 + 0x40) {
              pUVar15 = pUVar4;
            }
LAB_00671b16:
            pUVar23 = pUVar27;
            if (pUVar27 < pUVar15) {
              pCVar8 = (ClientContext *)*puVar29;
              uVar3 = puVar29[1];
              puVar26 = (undefined8 *)((long)pUVar27 * 0x10 + lVar14);
              do {
                right_04.value.pointer.ptr = (char *)lVar14;
                right_04.value._0_8_ = in_stack_fffffffffffffec8;
                fun_04.context = pCVar8;
                fun_04.search_path =
                     (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                      *)pCVar13;
                left_04.value.pointer.ptr = (char *)puVar26[-1];
                left_04.value._0_8_ = uVar3;
                UVar12 = (UnifiedVectorFormat)
                         BinaryLambdaWrapper::
                         Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                   (this_00,fun_04,left_04,right_04,(ValidityMask *)*puVar26,iVar31)
                ;
                pUVar27[iVar31] = UVar12;
                pUVar27 = pUVar27 + 1;
                puVar26 = puVar26 + 2;
                iVar19 = iVar31;
                pUVar23 = pUVar15;
              } while (pUVar15 != pUVar27);
            }
          }
          else {
            uVar20 = *(ulong *)(*(long *)(result + 0x28) + uVar22 * 8);
            pUVar15 = pUVar27 + 0x40;
            if (pUVar4 <= pUVar27 + 0x40) {
              pUVar15 = pUVar4;
            }
            pUVar23 = pUVar15;
            if (uVar20 != 0) {
              if (uVar20 == 0xffffffffffffffff) goto LAB_00671b16;
              pUVar23 = pUVar27;
              if (pUVar27 < pUVar15) {
                puVar26 = (undefined8 *)((long)pUVar27 * 0x10 + lVar14);
                uVar25 = 0;
                do {
                  if ((uVar20 >> (uVar25 & 0x3f) & 1) != 0) {
                    right_03.value.pointer.ptr = (char *)lVar14;
                    right_03.value._0_8_ = in_stack_fffffffffffffec8;
                    fun_03.context = (ClientContext *)*puVar29;
                    fun_03.search_path =
                         (unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
                          *)pCVar13;
                    left_03.value.pointer.ptr = (char *)puVar26[-1];
                    left_03.value._0_8_ = puVar29[1];
                    iVar19 = iVar31;
                    UVar12 = (UnifiedVectorFormat)
                             BinaryLambdaWrapper::
                             Operation<duckdb::InSearchPathFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,bool>
                                       (this_00,fun_03,left_03,right_03,(ValidityMask *)*puVar26,
                                        iVar31);
                    pUVar27[uVar25 + iVar18] = UVar12;
                    iVar31 = iVar19;
                  }
                  uVar25 = uVar25 + 1;
                  puVar26 = puVar26 + 2;
                  pUVar23 = pUVar15;
                } while ((long)pUVar15 - (long)pUVar27 != uVar25);
              }
            }
          }
          uVar22 = uVar22 + 1;
          iVar18 = iVar19;
          pUVar27 = pUVar23;
          if (uVar22 == (ulong)(pUVar4 + 0x3f) >> 6) {
            return;
          }
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar24);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void InSearchPathFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	auto &search_path = ClientData::Get(context).catalog_search_path;
	BinaryExecutor::Execute<string_t, string_t, bool>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t db_name, string_t schema_name) {
		    return search_path->SchemaInSearchPath(context, db_name.GetString(), schema_name.GetString());
	    });
}